

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::ForceManager::setupCutoffs(ForceManager *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  Globals *pGVar3;
  bool bVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  mapped_type *pmVar7;
  iterator iVar8;
  SwitchingFunction *this_00;
  _Base_ptr p_Var9;
  SwitchingFunctionType SVar10;
  locale *in_RCX;
  size_t __n;
  char *__src;
  RealType RVar11;
  double dVar12;
  string myMethod;
  allocator<char> local_b8 [32];
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  stringToCutoffMethod;
  AtomTypeSet atomTypes_;
  
  pGVar3 = this->info_->simParams_;
  this->rCut_ = 0.0;
  if ((pGVar3->MDfileVersion).super_ParameterBase.empty_ == false) {
    bVar5 = 1 < *(int *)&(pGVar3->MDfileVersion).super_ParameterBase.field_0x2c;
  }
  else {
    bVar5 = false;
  }
  p_Var1 = &atomTypes_._M_t._M_impl.super__Rb_tree_header;
  atomTypes_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  atomTypes_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  atomTypes_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  atomTypes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  atomTypes_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)&stringToCutoffMethod,this->info_);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::operator=(&atomTypes_._M_t,
              (_Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
               *)&stringToCutoffMethod);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree((_Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
               *)&stringToCutoffMethod);
  if ((pGVar3->CutoffRadius).super_ParameterBase.empty_ == false) {
    RVar11 = (pGVar3->CutoffRadius).data_;
    this->rCut_ = RVar11;
  }
  else {
    p_Var6 = atomTypes_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (this->info_->usesElectrostaticAtoms_ == true) {
      memcpy(&painCave,
             "ForceManager::setupCutoffs: No value was set for the cutoffRadius.\n\tOpenMD will use a default value of 12.0 angstroms for the cutoffRadius.\n"
             ,0x8d);
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      this->rCut_ = 12.0;
      RVar11 = 12.0;
    }
    else {
      for (; (_Rb_tree_header *)p_Var6 != p_Var1;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        RVar11 = InteractionManager::getSuggestedCutoffRadius
                           (this->interactionMan_,*(AtomType **)(p_Var6 + 1));
        dVar12 = this->rCut_;
        if (this->rCut_ <= RVar11) {
          dVar12 = RVar11;
        }
        this->rCut_ = dVar12;
      }
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: No value was set for the cutoffRadius.\n\tOpenMD will use %lf angstroms.\n"
               ,this->rCut_);
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      RVar11 = this->rCut_;
    }
  }
  ForceDecomposition::setCutoffRadius(this->fDecomp_,RVar11);
  InteractionManager::setCutoffRadius(this->interactionMan_,this->rCut_);
  this->rCutSq_ = this->rCut_ * this->rCut_;
  p_Var1 = &stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header;
  stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string<std::allocator<char>>((string *)&myMethod,"HARD",local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[](&stringToCutoffMethod,&myMethod);
  *pmVar7 = HARD;
  std::__cxx11::string::~string((string *)&myMethod);
  std::__cxx11::string::string<std::allocator<char>>((string *)&myMethod,"SWITCHED",local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[](&stringToCutoffMethod,&myMethod);
  *pmVar7 = SWITCHED;
  std::__cxx11::string::~string((string *)&myMethod);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&myMethod,"SHIFTED_POTENTIAL",local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[](&stringToCutoffMethod,&myMethod);
  *pmVar7 = SHIFTED_POTENTIAL;
  std::__cxx11::string::~string((string *)&myMethod);
  std::__cxx11::string::string<std::allocator<char>>((string *)&myMethod,"SHIFTED_FORCE",local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[](&stringToCutoffMethod,&myMethod);
  *pmVar7 = SHIFTED_FORCE;
  std::__cxx11::string::~string((string *)&myMethod);
  std::__cxx11::string::string<std::allocator<char>>((string *)&myMethod,"TAYLOR_SHIFTED",local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[](&stringToCutoffMethod,&myMethod);
  *pmVar7 = TAYLOR_SHIFTED;
  std::__cxx11::string::~string((string *)&myMethod);
  std::__cxx11::string::string<std::allocator<char>>((string *)&myMethod,"EWALD_FULL",local_b8);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[](&stringToCutoffMethod,&myMethod);
  *pmVar7 = EWALD_FULL;
  std::__cxx11::string::~string((string *)&myMethod);
  if ((pGVar3->CutoffMethod).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string((string *)local_b8,(string *)&(pGVar3->CutoffMethod).data_);
    std::locale::locale((locale *)local_98);
    toUpperCopy<std::__cxx11::string>
              (&myMethod,(OpenMD *)local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,in_RCX)
    ;
    std::locale::~locale((locale *)local_98);
    std::__cxx11::string::~string((string *)local_b8);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
            ::find(&stringToCutoffMethod._M_t,&myMethod);
    if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: Could not find chosen cutoffMethod %s\n\tShould be one of: HARD, SWITCHED, SHIFTED_POTENTIAL, TAYLOR_SHIFTED,\n\tSHIFTED_FORCE, or EWALD_FULL\n"
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      this->cutoffMethod_ = iVar8._M_node[2]._M_color;
    }
LAB_001d9125:
    std::__cxx11::string::~string((string *)&myMethod);
  }
  else if (bVar5) {
    memcpy(&painCave,
           "ForceManager::setupCutoffs: No value was set for the cutoffMethod.\n\tOpenMD will use SHIFTED_FORCE.\n"
           ,100);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    this->cutoffMethod_ = SHIFTED_FORCE;
  }
  else {
    memcpy(&painCave,
           "ForceManager::setupCutoffs : DEPRECATED FILE FORMAT!\n\tOpenMD found a file which does not set a cutoffMethod.\n\tOpenMD will attempt to deduce a cutoffMethod using the\n\tbehavior of the older (version 1) code.  To remove this\n\twarning, add an explicit cutoffMethod and change the top\n\tof the file so that it begins with <OpenMD version=2>\n"
           ,0x150);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    if ((pGVar3->ElectrostaticSummationMethod).super_ParameterBase.empty_ == false) {
      std::__cxx11::string::string
                ((string *)&myMethod,(string *)&(pGVar3->ElectrostaticSummationMethod).data_);
      std::locale::locale((locale *)local_b8);
      toUpper<std::__cxx11::string>(&myMethod,(locale *)local_b8);
      std::locale::~locale((locale *)local_b8);
      bVar4 = std::operator==(&myMethod,"SHIFTED_POTENTIAL");
      if (bVar4) {
        this->cutoffMethod_ = SHIFTED_POTENTIAL;
      }
      else {
        bVar4 = std::operator==(&myMethod,"SHIFTED_FORCE");
        if (bVar4) {
          this->cutoffMethod_ = SHIFTED_FORCE;
        }
        else {
          bVar4 = std::operator==(&myMethod,"TAYLOR_SHIFTED");
          if (bVar4) {
            this->cutoffMethod_ = TAYLOR_SHIFTED;
          }
          else {
            bVar4 = std::operator==(&myMethod,"EWALD_FULL");
            if (bVar4) {
              this->cutoffMethod_ = EWALD_FULL;
              this->useSurfaceTerm_ = true;
            }
          }
        }
      }
      if ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false) {
        this->rSwitch_ = (pGVar3->SwitchingRadius).data_;
      }
      bVar4 = std::operator==(&myMethod,"SHIFTED_POTENTIAL");
      if (((((bVar4) || (bVar4 = std::operator==(&myMethod,"SHIFTED_FORCE"), bVar4)) ||
           (bVar4 = std::operator==(&myMethod,"TAYLOR_SHIFTED"), bVar4)) ||
          (bVar4 = std::operator==(&myMethod,"EWALD_FULL"), bVar4)) &&
         ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false)) {
        snprintf(painCave.errMsg,2000,
                 "ForceManager::setupCutoffs : DEPRECATED ERROR MESSAGE\n\tA value was set for the switchingRadius\n\teven though the electrostaticSummationMethod was\n\tset to %s\n"
                );
        painCave.isFatal = 1;
        painCave.severity = 2;
        simError();
      }
      if (ABS(this->rCut_ - this->rSwitch_) < 0.0001) {
        if (this->cutoffMethod_ == SHIFTED_FORCE) {
          __src = 
          "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n\tcutoffRadius and switchingRadius are set to the\n\tsame value.  OpenMD will use shifted force\n\tpotentials instead of switching functions.\n"
          ;
          __n = 0xbb;
        }
        else {
          this->cutoffMethod_ = SHIFTED_POTENTIAL;
          __src = 
          "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n\tcutoffRadius and switchingRadius are set to the\n\tsame value.  OpenMD will use shifted potentials\n\tinstead of switching functions.\n"
          ;
          __n = 0xb5;
        }
        memcpy(&painCave,__src,__n);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
      }
      goto LAB_001d9125;
    }
  }
  this_00 = (SwitchingFunction *)operator_new(0x40);
  SwitchingFunction::SwitchingFunction(this_00);
  this->switcher_ = this_00;
  _Var2 = this->cutoffMethod_;
  if (_Var2 == _S_black) {
    if ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false) {
      dVar12 = (pGVar3->SwitchingRadius).data_;
      this->rSwitch_ = dVar12;
      if (dVar12 <= this->rCut_) goto LAB_001d9285;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: switchingRadius (%f) is larger than the cutoffRadius(%f)\n"
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
    }
    else {
      this->rSwitch_ = this->rCut_ * 0.85;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: No value was set for the switchingRadius.\n\tOpenMD will use a default value of 85 percent of the cutoffRadius.\n\tswitchingRadius = %f. for this simulation\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 2;
    }
    simError();
  }
  else {
    if ((bVar5) && ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false)) {
      myMethod._M_dataplus._M_p = (pointer)&myMethod.field_2;
      myMethod._M_string_length = 0;
      myMethod.field_2._M_local_buf[0] = '\0';
      for (p_Var9 = stringToCutoffMethod._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9))
      {
        if (p_Var9[2]._M_color == _Var2) {
          std::__cxx11::string::_M_assign((string *)&myMethod);
          break;
        }
      }
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: the cutoffMethod (%s)\n\tis not set to SWITCHED, so switchingRadius value\n\twill be ignored for this simulation\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
      std::__cxx11::string::~string((string *)&myMethod);
    }
    this->rSwitch_ = this->rCut_;
  }
LAB_001d9285:
  this->sft_ = cubic;
  SVar10 = cubic;
  if ((pGVar3->SwitchingFunctionType).super_ParameterBase.empty_ != false) goto LAB_001d933f;
  std::__cxx11::string::string((string *)&myMethod,(string *)&(pGVar3->SwitchingFunctionType).data_)
  ;
  std::locale::locale((locale *)local_b8);
  toUpper<std::__cxx11::string>(&myMethod,(locale *)local_b8);
  std::locale::~locale((locale *)local_b8);
  bVar5 = std::operator==(&myMethod,"CUBIC");
  SVar10 = cubic;
  if (bVar5) {
LAB_001d92f8:
    this->sft_ = SVar10;
  }
  else {
    bVar5 = std::operator==(&myMethod,"FIFTH_ORDER_POLYNOMIAL");
    if (bVar5) {
      SVar10 = fifth_order_poly;
      goto LAB_001d92f8;
    }
    snprintf(painCave.errMsg,2000,
             "ForceManager::setupSwitching : Unknown switchingFunctionType. (Input file specified %s .)\n\tswitchingFunctionType must be one of: \"cubic\" or \"fifth_order_polynomial\"."
             ,myMethod._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::__cxx11::string::~string((string *)&myMethod);
  SVar10 = this->sft_;
LAB_001d933f:
  SwitchingFunction::setSwitchType(this->switcher_,SVar10);
  SwitchingFunction::setSwitch(this->switcher_,this->rSwitch_,this->rCut_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  ::~_Rb_tree(&stringToCutoffMethod._M_t);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&atomTypes_._M_t);
  return;
}

Assistant:

void ForceManager::setupCutoffs() {
    Globals* simParams_ = info_->getSimParams();
    int mdFileVersion;
    rCut_ = 0.0;  // Needs a value for a later max() call;

    if (simParams_->haveMDfileVersion())
      mdFileVersion = simParams_->getMDfileVersion();
    else
      mdFileVersion = 0;

    // We need the list of simulated atom types to figure out cutoffs
    // as well as long range corrections.

    AtomTypeSet::iterator i;
    AtomTypeSet atomTypes_;
    atomTypes_ = info_->getSimulatedAtomTypes();

    if (simParams_->haveCutoffRadius()) {
      rCut_ = simParams_->getCutoffRadius();
    } else {
      if (info_->usesElectrostaticAtoms()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "cutoffRadius.\n"
                 "\tOpenMD will use a default value of 12.0 angstroms "
                 "for the cutoffRadius.\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        rCut_ = 12.0;
      } else {
        RealType thisCut;
        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
          thisCut = interactionMan_->getSuggestedCutoffRadius((*i));
          rCut_   = max(thisCut, rCut_);
        }
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "cutoffRadius.\n"
                 "\tOpenMD will use %lf angstroms.\n",
                 rCut_);
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
      }
    }

    fDecomp_->setCutoffRadius(rCut_);
    interactionMan_->setCutoffRadius(rCut_);
    rCutSq_ = rCut_ * rCut_;

    map<string, CutoffMethod> stringToCutoffMethod;
    stringToCutoffMethod["HARD"]              = HARD;
    stringToCutoffMethod["SWITCHED"]          = SWITCHED;
    stringToCutoffMethod["SHIFTED_POTENTIAL"] = SHIFTED_POTENTIAL;
    stringToCutoffMethod["SHIFTED_FORCE"]     = SHIFTED_FORCE;
    stringToCutoffMethod["TAYLOR_SHIFTED"]    = TAYLOR_SHIFTED;
    stringToCutoffMethod["EWALD_FULL"]        = EWALD_FULL;

    if (simParams_->haveCutoffMethod()) {
      string cutMeth = toUpperCopy(simParams_->getCutoffMethod());
      map<string, CutoffMethod>::iterator i;
      i = stringToCutoffMethod.find(cutMeth);
      if (i == stringToCutoffMethod.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: Could not find chosen "
                 "cutoffMethod %s\n"
                 "\tShould be one of: "
                 "HARD, SWITCHED, SHIFTED_POTENTIAL, TAYLOR_SHIFTED,\n"
                 "\tSHIFTED_FORCE, or EWALD_FULL\n",
                 cutMeth.c_str());
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        cutoffMethod_ = i->second;
      }
    } else {
      if (mdFileVersion > 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set "
                 "for the cutoffMethod.\n"
                 "\tOpenMD will use SHIFTED_FORCE.\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        cutoffMethod_ = SHIFTED_FORCE;
      } else {
        // handle the case where the old file version was in play
        // (there should be no cutoffMethod, so we have to deduce it
        // from other data).

        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs : DEPRECATED FILE FORMAT!\n"
                 "\tOpenMD found a file which does not set a cutoffMethod.\n"
                 "\tOpenMD will attempt to deduce a cutoffMethod using the\n"
                 "\tbehavior of the older (version 1) code.  To remove this\n"
                 "\twarning, add an explicit cutoffMethod and change the top\n"
                 "\tof the file so that it begins with <OpenMD version=2>\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();

        // The old file version tethered the shifting behavior to the
        // electrostaticSummationMethod keyword.

        if (simParams_->haveElectrostaticSummationMethod()) {
          string myMethod = simParams_->getElectrostaticSummationMethod();
          toUpper(myMethod);

          if (myMethod == "SHIFTED_POTENTIAL") {
            cutoffMethod_ = SHIFTED_POTENTIAL;
          } else if (myMethod == "SHIFTED_FORCE") {
            cutoffMethod_ = SHIFTED_FORCE;
          } else if (myMethod == "TAYLOR_SHIFTED") {
            cutoffMethod_ = TAYLOR_SHIFTED;
          } else if (myMethod == "EWALD_FULL") {
            cutoffMethod_   = EWALD_FULL;
            useSurfaceTerm_ = true;
          }

          if (simParams_->haveSwitchingRadius())
            rSwitch_ = simParams_->getSwitchingRadius();

          if (myMethod == "SHIFTED_POTENTIAL" || myMethod == "SHIFTED_FORCE" ||
              myMethod == "TAYLOR_SHIFTED" || myMethod == "EWALD_FULL") {
            if (simParams_->haveSwitchingRadius()) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED ERROR MESSAGE\n"
                       "\tA value was set for the switchingRadius\n"
                       "\teven though the electrostaticSummationMethod was\n"
                       "\tset to %s\n",
                       myMethod.c_str());
              painCave.severity = OPENMD_WARNING;
              painCave.isFatal  = 1;
              simError();
            }
          }
          if (abs(rCut_ - rSwitch_) < 0.0001) {
            if (cutoffMethod_ == SHIFTED_FORCE) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n"
                       "\tcutoffRadius and switchingRadius are set to the\n"
                       "\tsame value.  OpenMD will use shifted force\n"
                       "\tpotentials instead of switching functions.\n");
              painCave.isFatal  = 0;
              painCave.severity = OPENMD_WARNING;
              simError();
            } else {
              cutoffMethod_ = SHIFTED_POTENTIAL;
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n"
                       "\tcutoffRadius and switchingRadius are set to the\n"
                       "\tsame value.  OpenMD will use shifted potentials\n"
                       "\tinstead of switching functions.\n");
              painCave.isFatal  = 0;
              painCave.severity = OPENMD_WARNING;
              simError();
            }
          }
        }
      }
    }

    // create the switching function object:

    switcher_ = new SwitchingFunction();

    if (cutoffMethod_ == SWITCHED) {
      if (simParams_->haveSwitchingRadius()) {
        rSwitch_ = simParams_->getSwitchingRadius();
        if (rSwitch_ > rCut_) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::setupCutoffs: switchingRadius (%f) is larger "
                   "than the cutoffRadius(%f)\n",
                   rSwitch_, rCut_);
          painCave.isFatal  = 1;
          painCave.severity = OPENMD_ERROR;
          simError();
        }
      } else {
        rSwitch_ = 0.85 * rCut_;
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "switchingRadius.\n"
                 "\tOpenMD will use a default value of 85 percent of the "
                 "cutoffRadius.\n"
                 "\tswitchingRadius = %f. for this simulation\n",
                 rSwitch_);
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      }
    } else {
      if (mdFileVersion > 1) {
        // throw an error if we define a switching radius and don't need one.
        // older file versions should not do this.
        if (simParams_->haveSwitchingRadius()) {
          map<string, CutoffMethod>::const_iterator it;
          string theMeth;
          for (it = stringToCutoffMethod.begin();
               it != stringToCutoffMethod.end(); ++it) {
            if (it->second == cutoffMethod_) {
              theMeth = it->first;
              break;
            }
          }
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::setupCutoffs: the cutoffMethod (%s)\n"
                   "\tis not set to SWITCHED, so switchingRadius value\n"
                   "\twill be ignored for this simulation\n",
                   theMeth.c_str());
          painCave.isFatal  = 0;
          painCave.severity = OPENMD_WARNING;
          simError();
        }
      }
      rSwitch_ = rCut_;
    }

    // Default to cubic switching function.
    sft_ = cubic;
    if (simParams_->haveSwitchingFunctionType()) {
      string funcType = simParams_->getSwitchingFunctionType();
      toUpper(funcType);
      if (funcType == "CUBIC") {
        sft_ = cubic;
      } else {
        if (funcType == "FIFTH_ORDER_POLYNOMIAL") {
          sft_ = fifth_order_poly;
        } else {
          // throw error
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "ForceManager::setupSwitching : Unknown switchingFunctionType. "
              "(Input "
              "file specified %s .)\n"
              "\tswitchingFunctionType must be one of: "
              "\"cubic\" or \"fifth_order_polynomial\".",
              funcType.c_str());
          painCave.isFatal  = 1;
          painCave.severity = OPENMD_ERROR;
          simError();
        }
      }
    }
    switcher_->setSwitchType(sft_);
    switcher_->setSwitch(rSwitch_, rCut_);
  }